

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execBcc<(moira::Core)2,(moira::Instr)18,(moira::Mode)12,4>(Moira *this,u16 opcode)

{
  PrefetchQueue PVar1;
  u32 uVar2;
  u32 uVar3;
  
  this->cp = 0;
  uVar2 = (this->reg).pc;
  if (((this->reg).sr.n == (this->reg).sr.v) && (((this->reg).sr.z & 1U) == 0)) {
    (this->reg).pc = uVar2 + 2;
    uVar2 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    uVar2 = (this->reg).pc + 2;
    (this->reg).pc = uVar2;
    uVar3 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar2);
    (this->queue).irc = (u16)uVar3;
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (u16)uVar3;
    uVar2 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    this->readBuffer = (u16)uVar2;
  }
  else {
    PVar1 = this->queue;
    (this->reg).pc = uVar2 + 2;
    uVar3 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar3;
    (this->reg).pc = (int)PVar1 * 0x10000 + uVar2 + (uVar3 & 0xffff);
    fullPrefetch<(moira::Core)2,4ull,0>(this);
  }
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 6));
  return;
}

Assistant:

void
Moira::execBcc(u16 opcode)
{
    AVAILABILITY(S == Long ? Core::C68020 : Core::C68000)

    u32 oldpc = reg.pc;

    SYNC(2);

    if (cond<I>()) {

        u32 disp = S == Byte ? (u8)opcode : queue.irc;

        if (S == Long) {

            readExt<C>();
            disp = disp << 16 | queue.irc;
        }

        u32 newpc = U32_ADD(oldpc, SEXT<S>(disp));

        // Check for address error
        if (misaligned<C>(newpc)) {
            throw AddressError(makeFrame(newpc));
        }

        // Take branch
        reg.pc = newpc;
        fullPrefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_IP   (10, 10,  6,       10, 10,  6,        0,  0,  6)

    } else {

        // Fall through to next instruction
        if constexpr (C == Core::C68000) SYNC(2);
        if constexpr (S == Word || S == Long) readExt<C>();
        if constexpr (S == Long) readExt<C>();
        prefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_IP   ( 8,  6,  4,       12, 10,  6,        0,  0,  6)
    }

    FINALIZE
}